

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathFuncs.cpp
# Opt level: O2

void __thiscall slang::ast::builtins::Clog2Function::~Clog2Function(Clog2Function *this)

{
  SystemSubroutine::~SystemSubroutine(&this->super_SystemSubroutine);
  operator_delete(this,0x38);
  return;
}

Assistant:

Clog2Function() : SystemSubroutine(KnownSystemName::Clog2, SubroutineKind::Function) {}